

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::
get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
          (Attribute *this,
          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *v)

{
  value_type *__x;
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> local_60;
  undefined1 local_40 [8];
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> ret;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *v_local;
  Attribute *this_local;
  
  if (v == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._16_8_ = v;
    primvar::PrimVar::
    get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
              (&local_60,&this->_var);
    nonstd::optional_lite::
    optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
    optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_0>
              ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                *)local_40,&local_60);
    nonstd::optional_lite::
    optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
    ~optional(&local_60);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (this_local._7_1_) {
      __x = nonstd::optional_lite::
            optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::value((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                     *)local_40);
      std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::operator=
                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 ret.contained._16_8_,__x);
    }
    nonstd::optional_lite::
    optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
    ~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
               *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }